

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaPNQOut.cpp
# Opt level: O1

void __thiscall NaPNQueueOutput::get_data(NaPNQueueOutput *this,NaReal *pPortion)

{
  int iVar1;
  uint uVar2;
  NaVector *pNVar3;
  ulong uVar4;
  NaReal NVar5;
  
  if (pPortion != (NaReal *)0x0) {
    pNVar3 = NaPetriCnInput::data(&this->in);
    iVar1 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
    if (iVar1 != 0) {
      uVar4 = 0;
      do {
        NVar5 = NaVector::operator()(&this->vQueue,(uint)uVar4);
        pPortion[uVar4] = NVar5;
        uVar4 = uVar4 + 1;
        pNVar3 = NaPetriCnInput::data(&this->in);
        uVar2 = (*pNVar3->_vptr_NaVector[6])(pNVar3);
      } while (uVar4 < uVar2);
    }
  }
  if (this->nQLimit != 0) {
    pNVar3 = &this->vQueue;
    iVar1 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
    NaVector::shift(pNVar3,-iVar1);
    uVar2 = NaVector::dim(pNVar3);
    iVar1 = (*(this->super_NaPetriNode)._vptr_NaPetriNode[0x15])(this);
    NaVector::new_dim(pNVar3,uVar2 - iVar1);
    return;
  }
  return;
}

Assistant:

void
NaPNQueueOutput::get_data (NaReal* pPortion)
{
  unsigned	i;

  if(NULL != pPortion){
    // Get data from the queue
    for(i = 0; i < in.data().dim(); ++i){
      pPortion[i] = vQueue(i);
    }
  }
  // else
  //   remove

  if(nQLimit > 0){
    // Remove data portion
    vQueue.shift(- (int)get_data_dim());
    vQueue.new_dim(vQueue.dim() - get_data_dim());
  }
}